

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qft.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  QObject<std::complex<double>_> *pQVar1;
  pointer puVar2;
  int iVar3;
  int *piVar4;
  long *plVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  pointer puVar9;
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> circuit;
  stringstream qasm;
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> local_208;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  _func_int *local_1a8 [14];
  ios_base local_138 [264];
  
  lVar7 = 5;
  lVar8 = 2;
  if (argc < 2) goto LAB_00105754;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,argv[1],(allocator<char> *)&local_1d8);
  uVar6 = local_1b8._0_8_;
  piVar4 = __errno_location();
  iVar3 = *piVar4;
  *piVar4 = 0;
  lVar8 = strtol((char *)uVar6,(char **)&local_208,10);
  if (local_208.super_QObject<std::complex<double>_>._vptr_QObject == (_func_int **)uVar6) {
    std::__throw_invalid_argument("stoi");
LAB_00105962:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar8 != lVar8) || (*piVar4 == 0x22)) goto LAB_00105962;
    lVar7 = 5;
    if (*piVar4 == 0) {
      *piVar4 = iVar3;
    }
    if ((_func_int **)local_1b8._0_8_ != local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0] + 1));
    }
    if (argc == 2) {
LAB_00105754:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"nb qubits = ",0xc);
      iVar3 = (int)lVar8;
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      local_208.super_QAdjustable.fixed_ = false;
      local_208.super_QObject<std::complex<double>_>._vptr_QObject =
           (_func_int **)&PTR_nbQubits_001239a0;
      local_208.offset_ = 0;
      local_208.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.nbQubits_ = iVar3;
      if (iVar3 < 1) {
        __assert_fail("nbQubits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/QCircuit.hpp"
                      ,0x34,
                      "qclab::QCircuit<std::complex<double>>::QCircuit(const int) [T = std::complex<double>, G = qclab::QObject<std::complex<double>>]"
                     );
      }
      qft<std::complex<double>>(&local_208);
      if (iVar3 <= (int)lVar7) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nmatrix =",9);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::matrix
                  ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
                   local_1b8);
        qclab::printMatrix<qclab::dense::SquareMatrix<std::complex<double>>>
                  ((SquareMatrix<std::complex<double>_> *)local_1b8);
        if ((tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
            local_1b8._8_8_ != (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
          operator_delete__((void *)local_1b8._8_8_);
        }
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      if (local_208.gates_.
          super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_208.gates_.
          super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        puVar2 = local_208.gates_.
                 super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          puVar9 = puVar2 + 1;
          pQVar1 = (puVar2->_M_t).
                   super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                   .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>.
                   _M_head_impl;
          iVar3 = (*pQVar1->_vptr_QObject[0xb])(pQVar1,local_1a8,(ulong)(uint)local_208.offset_);
          if (iVar3 != 0) break;
          puVar2 = puVar9;
        } while (puVar9 != local_208.gates_.
                           super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nqasm:\n",7);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_1d8,local_1d0);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      local_208.super_QObject<std::complex<double>_>._vptr_QObject =
           (_func_int **)&PTR_nbQubits_001239a0;
      std::
      vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
      ::~vector(&local_208.gates_);
      return 0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,argv[2],(allocator<char> *)&local_1d8);
    uVar6 = local_1b8._0_8_;
    iVar3 = *piVar4;
    *piVar4 = 0;
    lVar7 = strtol((char *)local_1b8._0_8_,(char **)&local_208,10);
    if (local_208.super_QObject<std::complex<double>_>._vptr_QObject != (_func_int **)uVar6) {
      if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar3;
        }
        if ((_func_int **)local_1b8._0_8_ != local_1a8) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0] + 1));
        }
        goto LAB_00105754;
      }
      goto LAB_0010597a;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0010597a:
  uVar6 = std::__throw_out_of_range("stoi");
  _Unwind_Resume(uVar6);
}

Assistant:

int main( int argc , char *argv[] ) {

  using T = std::complex< double > ;

  // defaults
  int nbQubits = 2 ;
  int maxPrint = 5 ;

  // arguments
  if ( argc > 1 ) nbQubits = std::stoi( argv[1] ) ;
  if ( argc > 2 ) maxPrint = std::stoi( argv[2] ) ;
  std::cout << "nb qubits = " << nbQubits << std::endl ;

  // quantum circuit
  qclab::QCircuit< T > circuit( nbQubits ) ;

  // qft
  qft( circuit ) ;

  // print matrix
  if ( nbQubits <= maxPrint ) {
    std::cout << "\nmatrix =" << std::endl ;
    qclab::printMatrix( circuit.matrix() ) ;
  }

  // print qasm
  std::stringstream qasm ;
  circuit.toQASM( qasm ) ;
  std::cout << "\nqasm:\n" << qasm.str() ;

  // successful
  return 0 ;

}